

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

bool __thiscall GEO::Logger::get_local_value(Logger *this,string *name,string *value)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  ulong uVar3;
  char *pcVar4;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    uVar3 = (ulong)this->quiet_;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      uVar3 = (ulong)this->minimal_;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          std::__cxx11::string::_M_assign((string *)value);
          return true;
        }
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          if (this->log_everything_ == true) {
            std::__cxx11::string::operator=((string *)value,"*");
            return true;
          }
          std::__cxx11::string::operator=((string *)value,"");
          for (p_Var2 = (this->log_features_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var2 != &(this->log_features_)._M_t._M_impl.super__Rb_tree_header
              ; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
            if (value->_M_string_length != 0) {
              std::__cxx11::string::push_back((char)value);
            }
            std::__cxx11::string::_M_append((char *)value,*(ulong *)(p_Var2 + 1));
          }
          return true;
        }
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          std::__cxx11::string::operator=((string *)value,"");
          for (p_Var2 = (this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              (_Rb_tree_header *)p_Var2 !=
              &(this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header;
              p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
            if (value->_M_string_length != 0) {
              std::__cxx11::string::push_back((char)value);
            }
            std::__cxx11::string::_M_append((char *)value,*(ulong *)(p_Var2 + 1));
          }
          return true;
        }
        return false;
      }
      uVar3 = (ulong)this->pretty_;
    }
  }
  pcVar4 = "false";
  if (uVar3 != 0) {
    pcVar4 = "true";
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,pcVar4,pcVar4 + (uVar3 ^ 5));
  std::__cxx11::string::operator=((string *)value,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return true;
}

Assistant:

bool Logger::get_local_value(
        const std::string& name, std::string& value
    ) const {

        if(name == "log:quiet") {
            value = String::to_string(is_quiet());
            return true;
        }

        if(name == "log:minimal") {
            value = String::to_string(is_minimal());
            return true;
        }
        
        if(name == "log:pretty") {
            value = String::to_string(is_pretty());
            return true;
        }

        if(name == "log:file_name") {
            value = log_file_name_;
            return true;
        }

        if(name == "log:features") {
            if(log_everything_) {
                value = "*";
            } else {
                value = "";
                for(auto& it : log_features_) {
                    if(value.length() != 0) {
                        value += ';';
                    }
                    value += it;
                }
            }
            return true;
        }

        if(name == "log:features_exclude") {
            value = "";
            for(auto& it : log_features_exclude_) {
                if(value.length() != 0) {
                    value += ';';
                }
                value += it;
            }
            return true;
        }

        return false;
    }